

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::Imputer::_InternalSerialize
          (Imputer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  DoubleVector *pDVar2;
  Int64Vector *this_00;
  StringToDoubleMap *this_01;
  Int64ToDoubleMap *this_02;
  void *data;
  bool bVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  int size;
  string *psVar9;
  ulong uVar10;
  uint8_t *puVar11;
  size_t __n;
  ImputedValueUnion IVar12;
  ReplaceValueUnion RVar13;
  
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 1) {
    if (target < stream->end_) {
LAB_0020038b:
      IVar12 = this->ImputedValue_;
    }
    else {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      IVar12.imputeddoublevalue_ = 0.0;
      if (this->_oneof_case_[0] == 1) goto LAB_0020038b;
    }
    *target = '\t';
    *(ImputedValueUnion *)(target + 1) = IVar12;
    target = target + 9;
    uVar4 = this->_oneof_case_[0];
  }
  puVar11 = target;
  if (uVar4 == 2) {
    if ((target < stream->end_) ||
       (target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target),
       this->_oneof_case_[0] == 2)) {
      pDVar2 = (this->ImputedValue_).imputeddoublearray_;
      *target = '\x10';
      target[1] = (byte)pDVar2;
      if ((DoubleVector *)0x7f < pDVar2) {
        target[1] = (byte)pDVar2 | 0x80;
        target[2] = (uint8_t)((ulong)pDVar2 >> 7);
        puVar11 = target + 3;
        if ((DoubleVector *)0x3fff < pDVar2) {
          uVar10 = (ulong)target[2];
          uVar6 = (ulong)pDVar2 >> 7;
          do {
            puVar11[-1] = (byte)uVar10 | 0x80;
            uVar8 = uVar6 >> 7;
            *puVar11 = (uint8_t)uVar8;
            puVar11 = puVar11 + 1;
            uVar10 = uVar8 & 0xffffffff;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar8;
          } while (bVar3);
        }
        goto LAB_002003ca;
      }
    }
    else {
      target[0] = '\x10';
      target[1] = '\0';
    }
    puVar11 = target + 2;
  }
LAB_002003ca:
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 3) {
    puVar5 = (undefined8 *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.imputedStringValue");
    if (this->_oneof_case_[0] == 3) {
      psVar9 = (string *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar9 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    puVar11 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                        (stream,3,psVar9,puVar11);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 4) {
    if (stream->end_ <= puVar11) {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11);
    }
    pDVar2 = (this->ImputedValue_).imputeddoublearray_;
    *puVar11 = '\"';
    uVar1 = (pDVar2->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar11[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar11 = puVar11 + 2;
    }
    else {
      puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar11 + 1);
    }
    puVar11 = DoubleVector::_InternalSerialize(pDVar2,puVar11,stream);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 5) {
    if (stream->end_ <= puVar11) {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11);
    }
    this_00 = (this->ImputedValue_).imputedint64array_;
    *puVar11 = '*';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar11[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar11 = puVar11 + 2;
    }
    else {
      puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar11 + 1);
    }
    puVar11 = Int64Vector::_InternalSerialize(this_00,puVar11,stream);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 6) {
    if (stream->end_ <= puVar11) {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11);
    }
    this_01 = (this->ImputedValue_).imputedstringdictionary_;
    *puVar11 = '2';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar11[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar11 = puVar11 + 2;
    }
    else {
      puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar11 + 1);
    }
    puVar11 = StringToDoubleMap::_InternalSerialize(this_01,puVar11,stream);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 7) {
    if (stream->end_ <= puVar11) {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11);
    }
    this_02 = (this->ImputedValue_).imputedint64dictionary_;
    *puVar11 = ':';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar11[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar11 = puVar11 + 2;
    }
    else {
      puVar11 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar11 + 1);
    }
    puVar11 = Int64ToDoubleMap::_InternalSerialize(this_02,puVar11,stream);
  }
  uVar4 = this->_oneof_case_[1];
  if (uVar4 == 0xb) {
    if (puVar11 < stream->end_) {
LAB_00200563:
      RVar13 = this->ReplaceValue_;
    }
    else {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11);
      RVar13.replacedoublevalue_ = 0.0;
      if (this->_oneof_case_[1] == 0xb) goto LAB_00200563;
    }
    *puVar11 = 'Y';
    *(ReplaceValueUnion *)(puVar11 + 1) = RVar13;
    puVar11 = puVar11 + 9;
    uVar4 = this->_oneof_case_[1];
  }
  if (uVar4 == 0xc) {
    puVar7 = puVar11;
    if ((puVar11 < stream->end_) ||
       (puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar11),
       this->_oneof_case_[1] == 0xc)) {
      uVar6 = (this->ReplaceValue_).replaceint64value_;
      *puVar7 = '`';
      puVar7[1] = (byte)uVar6;
      if (0x7f < uVar6) {
        puVar7[1] = (byte)uVar6 | 0x80;
        puVar7[2] = (uint8_t)(uVar6 >> 7);
        puVar11 = puVar7 + 3;
        if (0x3fff < uVar6) {
          uVar10 = (ulong)puVar7[2];
          uVar6 = uVar6 >> 7;
          do {
            puVar11[-1] = (byte)uVar10 | 0x80;
            uVar8 = uVar6 >> 7;
            *puVar11 = (uint8_t)uVar8;
            puVar11 = puVar11 + 1;
            uVar10 = uVar8 & 0xffffffff;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar8;
          } while (bVar3);
        }
        goto LAB_002005a6;
      }
    }
    else {
      puVar7[0] = '`';
      puVar7[1] = '\0';
    }
    puVar11 = puVar7 + 2;
  }
LAB_002005a6:
  if (this->_oneof_case_[1] == 0xd) {
    puVar5 = (undefined8 *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.replaceStringValue");
    if (this->_oneof_case_[1] == 0xd) {
      psVar9 = (string *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar9 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    puVar11 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                        (stream,0xd,psVar9,puVar11);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    data = *(void **)(uVar6 + 8);
    size = (int)*(undefined8 *)(uVar6 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar11 < (long)__n) {
      puVar11 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                          (stream,data,size,puVar11);
      return puVar11;
    }
    memcpy(puVar11,data,__n);
    puVar11 = puVar11 + __n;
  }
  return puVar11;
}

Assistant:

uint8_t* Imputer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Imputer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (_internal_has_imputeddoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_imputeddoublevalue(), target);
  }

  // int64 imputedInt64Value = 2;
  if (_internal_has_imputedint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_imputedint64value(), target);
  }

  // string imputedStringValue = 3;
  if (_internal_has_imputedstringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_imputedstringvalue().data(), static_cast<int>(this->_internal_imputedstringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_imputedstringvalue(), target);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (_internal_has_imputeddoublearray()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::imputeddoublearray(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (_internal_has_imputedint64array()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::imputedint64array(this), target, stream);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (_internal_has_imputedstringdictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::imputedstringdictionary(this), target, stream);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (_internal_has_imputedint64dictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::imputedint64dictionary(this), target, stream);
  }

  // double replaceDoubleValue = 11;
  if (_internal_has_replacedoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_replacedoublevalue(), target);
  }

  // int64 replaceInt64Value = 12;
  if (_internal_has_replaceint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(12, this->_internal_replaceint64value(), target);
  }

  // string replaceStringValue = 13;
  if (_internal_has_replacestringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_replacestringvalue().data(), static_cast<int>(this->_internal_replacestringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_replacestringvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Imputer)
  return target;
}